

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O3

int AF_A_SerpentCheckForAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  FState *newstate;
  AActor *this;
  VMValue *pVVar8;
  FName *label;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName FStack_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  label = &FStack_38;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e9397;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005e9387;
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005e91db;
    pPVar7 = (this->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (this->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar9 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar9;
    bVar10 = pPVar7 == pPVar4;
    if (!bVar10 && !bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
    uVar6 = (uint)bVar9;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005e9397;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005e9387;
LAB_005e91db:
    this = (AActor *)0x0;
    pVVar8 = param;
    uVar6 = numparam;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005e929b;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005e9387:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005e9397;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar7 = (PClass *)puVar2[1];
        if (pPVar7 == (PClass *)0x0) {
          pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar6,ret);
          puVar2[1] = pPVar7;
        }
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e9397;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005e9387;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e929b:
    pAVar3 = (this->target).field_0.p;
    if (pAVar3 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((this->MissileState == (FState *)0x0) || (bVar9 = AActor::CheckMeleeRange(this), bVar9)) {
        bVar9 = P_CheckMeleeRange2(this);
        if (bVar9) {
          iVar5 = FName::NameManager::FindName(&FName::NameData,"Walk",false);
          label = &local_30;
        }
        else {
          bVar9 = AActor::CheckMeleeRange(this);
          if (!bVar9) {
            return 0;
          }
          uVar6 = FRandom::GenRand32(&pr_serpentattack);
          if ((uVar6 & 0xe0) == 0) {
            iVar5 = FName::NameManager::FindName(&FName::NameData,"Walk",false);
            label = &local_34;
          }
          else {
            iVar5 = FName::NameManager::FindName(&FName::NameData,"Attack",false);
          }
        }
      }
      else {
        iVar5 = FName::NameManager::FindName(&FName::NameData,"Attack",false);
        label = &local_2c;
      }
      label->Index = iVar5;
      newstate = AActor::FindState(this,label);
      AActor::SetState(this,newstate,false);
      return 0;
    }
    (this->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005e9397:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0x82,
                "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentCheckForAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		if (!self->CheckMeleeRange ())
		{
			self->SetState (self->FindState ("Attack"));
			return 0;
		}
	}
	if (P_CheckMeleeRange2 (self))
	{
		self->SetState (self->FindState ("Walk"));
	}
	else if (self->CheckMeleeRange ())
	{
		if (pr_serpentattack() < 32)
		{
			self->SetState (self->FindState ("Walk"));
		}
		else
		{
			self->SetState (self->FindState ("Attack"));
		}
	}
	return 0;
}